

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O3

void runCommand(string *strCommand)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  int *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nErr;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [3];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (strCommand->_M_string_length != 0) {
    local_d0[0]._M_dataplus._M_p._0_4_ = system((strCommand->_M_dataplus)._M_p);
    if ((int)local_d0[0]._M_dataplus._M_p != 0) {
      pLVar2 = LogInstance();
      bVar1 = BCLog::Logger::Enabled(pLVar2);
      if (bVar1) {
        local_48._M_string_length = 0;
        local_48.field_2._M_local_buf[0] = '\0';
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        tinyformat::format<std::__cxx11::string,int>
                  (&local_68,(tinyformat *)"runCommand error: system(%s) returned %d\n",
                   (char *)strCommand,local_d0,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_48,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pLVar2 = LogInstance();
        local_68._M_dataplus._M_p = (pointer)0x5a;
        local_68._M_string_length = 0x4c3ab7;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/system.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = local_48._M_dataplus._M_p;
        str._M_len = local_48._M_string_length;
        logging_function._M_str = "runCommand";
        logging_function._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x37,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void runCommand(const std::string& strCommand)
{
    if (strCommand.empty()) return;
#ifndef WIN32
    int nErr = ::system(strCommand.c_str());
#else
    int nErr = ::_wsystem(std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t>().from_bytes(strCommand).c_str());
#endif
    if (nErr)
        LogPrintf("runCommand error: system(%s) returned %d\n", strCommand, nErr);
}